

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          Descriptor *descriptor,Context *context)

{
  FieldDescriptor *field;
  ulong __n;
  long lVar1;
  long lVar2;
  JavaType JVar3;
  int iVar4;
  int iVar5;
  ulong *puVar6;
  Descriptor *pDVar7;
  RepeatedImmutableEnumFieldGenerator *this_00;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_01;
  ulong uVar8;
  long i;
  ulong uVar9;
  int messageBitIndex;
  long lVar10;
  int local_4c;
  
  this->descriptor_ = descriptor;
  uVar8 = (ulong)*(int *)(descriptor + 0x2c);
  __n = uVar8 * 8;
  uVar9 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar9 = 0xffffffffffffffff;
  }
  if ((long)uVar8 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar9);
  *puVar6 = uVar8;
  if (uVar8 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *)(puVar6 + 1),0,
           __n);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *)(puVar6 + 1);
  lVar10 = 0;
  local_4c = 0;
  messageBitIndex = 0;
  for (i = 0; i < (int)uVar8; i = i + 1) {
    lVar1 = *(long *)(descriptor + 0x30);
    field = (FieldDescriptor *)(lVar1 + lVar10);
    if (*(int *)(lVar1 + 0x4c + lVar10) == 3) {
      JVar3 = GetJavaType(field);
      if (JVar3 == JAVATYPE_STRING) {
        this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
        RepeatedImmutableStringFieldGenerator::RepeatedImmutableStringFieldGenerator
                  ((RepeatedImmutableStringFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                   context);
      }
      else if (JVar3 == JAVATYPE_ENUM) {
        this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
        RepeatedImmutableEnumFieldGenerator::RepeatedImmutableEnumFieldGenerator
                  (this_00,field,messageBitIndex,local_4c,context);
      }
      else if (JVar3 == JAVATYPE_MESSAGE) {
        pDVar7 = FieldDescriptor::message_type(field);
        if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x6b) == '\x01') {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x48);
          ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
                    ((ImmutableMapFieldGenerator *)this_00,field,messageBitIndex,local_4c,context);
        }
        else if ((((context->options_).enforce_lite == false) &&
                 (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar10) + 0xa0) + 0xa8) != 3)) ||
                (*(char *)(*(long *)(lVar1 + 0x80 + lVar10) + 0x6d) != '\x01')) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          RepeatedImmutableMessageFieldGenerator::RepeatedImmutableMessageFieldGenerator
                    ((RepeatedImmutableMessageFieldGenerator *)this_00,field,messageBitIndex,
                     local_4c,context);
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          RepeatedImmutableLazyMessageFieldGenerator::RepeatedImmutableLazyMessageFieldGenerator
                    ((RepeatedImmutableLazyMessageFieldGenerator *)this_00,field,messageBitIndex,
                     local_4c,context);
        }
      }
      else {
        this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
        RepeatedImmutablePrimitiveFieldGenerator::RepeatedImmutablePrimitiveFieldGenerator
                  ((RepeatedImmutablePrimitiveFieldGenerator *)this_00,field,messageBitIndex,
                   local_4c,context);
      }
    }
    else {
      lVar2 = *(long *)(lVar1 + 0x60 + lVar10);
      JVar3 = GetJavaType(field);
      if (lVar2 == 0) {
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
                    ((ImmutableStringFieldGenerator *)this_00,field,messageBitIndex,local_4c,context
                    );
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
                    ((ImmutableEnumFieldGenerator *)this_00,field,messageBitIndex,local_4c,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          if ((((context->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar10) + 0xa0) + 0xa8) != 3)) ||
             (*(char *)(*(long *)(lVar1 + 0x80 + lVar10) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
                      ((ImmutableMessageFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                       context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableLazyMessageFieldGenerator::ImmutableLazyMessageFieldGenerator
                      ((ImmutableLazyMessageFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                       context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
                    ((ImmutablePrimitiveFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                     context);
        }
      }
      else if (JVar3 == JAVATYPE_STRING) {
        this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
        ImmutableStringOneofFieldGenerator::ImmutableStringOneofFieldGenerator
                  ((ImmutableStringOneofFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                   context);
      }
      else if (JVar3 == JAVATYPE_ENUM) {
        this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
        ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
                  ((ImmutableEnumOneofFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                   context);
      }
      else if (JVar3 == JAVATYPE_MESSAGE) {
        if ((((context->options_).enforce_lite == false) &&
            (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar10) + 0xa0) + 0xa8) != 3)) ||
           (*(char *)(*(long *)(lVar1 + 0x80 + lVar10) + 0x6d) != '\x01')) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableMessageOneofFieldGenerator::ImmutableMessageOneofFieldGenerator
                    ((ImmutableMessageOneofFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                     context);
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableLazyMessageOneofFieldGenerator::ImmutableLazyMessageOneofFieldGenerator
                    ((ImmutableLazyMessageOneofFieldGenerator *)this_00,field,messageBitIndex,
                     local_4c,context);
        }
      }
      else {
        this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
        ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator
                  ((ImmutablePrimitiveOneofFieldGenerator *)this_00,field,messageBitIndex,local_4c,
                   context);
      }
    }
    this_01 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
              ::operator[](&this->field_generators_,i);
    internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>::reset
              (this_01,&this_00->super_ImmutableFieldGenerator);
    iVar4 = (*(this_00->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[2])(this_00);
    iVar5 = (*(this_00->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[3])(this_00);
    messageBitIndex = messageBitIndex + iVar4;
    local_4c = local_4c + iVar5;
    uVar8 = (ulong)*(uint *)(descriptor + 0x2c);
    lVar10 = lVar10 + 0xa8;
  }
  return;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator>::FieldGeneratorMap(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      field_generators_(new google::protobuf::scoped_ptr<
          ImmutableFieldGenerator>[descriptor->field_count()]) {

  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    ImmutableFieldGenerator* generator = MakeImmutableGenerator(
        descriptor->field(i), messageBitIndex, builderBitIndex, context);
    field_generators_[i].reset(generator);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
  }
}